

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::SetShadingPropertiesRaw
          (FBXConverter *this,aiMaterial *out_mat,PropertyTable *props,TextureMap *textures,
          MeshGeometry *mesh)

{
  undefined8 uVar1;
  ulong __n;
  key_type *__k;
  PropertyTable *this_00;
  byte bVar2;
  aiMaterial *paVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  _Rb_tree_node_base *p_Var7;
  iterator iVar8;
  mapped_type *pmVar9;
  Property *pPVar10;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_> _Var11
  ;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar12;
  long *plVar13;
  MeshGeometry *this_01;
  MatIndexArray *pMVar14;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var15;
  undefined8 *puVar16;
  _Base_ptr p_Var17;
  size_type *psVar18;
  _Self __tmp;
  uint uVar19;
  size_t __n_00;
  char *pcVar20;
  bool bVar21;
  bool bVar22;
  int uvIndex;
  string name;
  uint matIndex;
  string prefix;
  int value;
  uint local_6ac;
  aiMaterial *local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  FBXConverter *local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  _Base_ptr local_618;
  MeshGeometry *local_610;
  undefined4 local_604;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  VideoMap *local_5e0;
  _Base_ptr local_5d8;
  _Base_ptr local_5d0;
  _Base_ptr local_5c8;
  undefined1 local_5c0 [112];
  ios_base local_550 [264];
  undefined4 local_448;
  undefined4 uStack_444;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  undefined4 local_438;
  aiString local_434;
  
  local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
  local_6a8 = out_mat;
  local_618 = (_Base_ptr)textures;
  local_610 = mesh;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"$raw.","");
  PropertyTable::GetUnparsedProperties_abi_cxx11_((DirectPropertyMap *)local_5c0,props);
  local_680 = this;
  if ((_Rb_tree_node_base *)local_5c0._24_8_ != (_Rb_tree_node_base *)(local_5c0 + 8)) {
    p_Var7 = (_Rb_tree_node_base *)local_5c0._24_8_;
    do {
      std::operator+(&local_678,&local_600,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var7 + 1));
      uVar1 = *(undefined8 *)(p_Var7 + 2);
      lVar6 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,0
                            );
      if (lVar6 == 0) {
        lVar6 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<aiColor3D>::typeinfo,0);
        if (lVar6 == 0) {
          lVar6 = __dynamic_cast(uVar1,&Property::typeinfo,
                                 &TypedProperty<aiColor4t<float>>::typeinfo,0);
          if (lVar6 == 0) {
            lVar6 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
            if (lVar6 == 0) {
              lVar6 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<int>::typeinfo,0);
              if (lVar6 == 0) {
                lVar6 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<bool>::typeinfo,0);
                if (lVar6 == 0) {
                  lVar6 = __dynamic_cast(uVar1,&Property::typeinfo,
                                         &TypedProperty<std::__cxx11::string>::typeinfo,0);
                  if (lVar6 != 0) {
                    __n_00 = *(ulong *)(lVar6 + 0x10) & 0xffffffff;
                    if ((*(ulong *)(lVar6 + 0x10) & 0xfffffc00) != 0) {
                      __n_00 = 0x3ff;
                    }
                    local_434.length = (ai_uint32)__n_00;
                    memcpy(local_434.data,*(void **)(lVar6 + 8),__n_00);
                    local_434.data[__n_00] = '\0';
                    aiMaterial::AddProperty(local_6a8,&local_434,local_678._M_dataplus._M_p,0,0);
                  }
                }
                else {
                  local_434.length = (ai_uint32)*(byte *)(lVar6 + 8);
                  aiMaterial::AddBinaryProperty
                            (local_6a8,&local_434,4,local_678._M_dataplus._M_p,0,0,aiPTI_Integer);
                }
              }
              else {
                aiMaterial::AddBinaryProperty
                          (local_6a8,(void *)(lVar6 + 8),4,local_678._M_dataplus._M_p,0,0,
                           aiPTI_Integer);
              }
            }
            else {
              aiMaterial::AddBinaryProperty
                        (local_6a8,(void *)(lVar6 + 8),4,local_678._M_dataplus._M_p,0,0,aiPTI_Float)
              ;
            }
          }
          else {
            aiMaterial::AddBinaryProperty
                      (local_6a8,(void *)(lVar6 + 8),0x10,local_678._M_dataplus._M_p,0,0,aiPTI_Float
                      );
          }
        }
        else {
          aiMaterial::AddBinaryProperty
                    (local_6a8,(void *)(lVar6 + 8),0xc,local_678._M_dataplus._M_p,0,0,aiPTI_Float);
        }
      }
      else {
        aiMaterial::AddBinaryProperty
                  (local_6a8,(void *)(lVar6 + 8),0xc,local_678._M_dataplus._M_p,0,0,aiPTI_Float);
      }
      this = local_680;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_678._M_dataplus._M_p != &local_678.field_2) {
        operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != (_Rb_tree_node_base *)(local_5c0 + 8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
               *)local_5c0);
  p_Var17 = (((_Rep_type *)&local_618->_M_color)->_M_impl).super__Rb_tree_header._M_header._M_left;
  local_618 = &(((_Rep_type *)&local_618->_M_color)->_M_impl).super__Rb_tree_header._M_header;
  if (p_Var17 != local_618) {
    local_5e0 = &this->textures_converted;
    local_5d0 = &(this->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_5d8 = &(this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      std::operator+(&local_678,&local_600,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var17 + 1));
      lVar6 = *(long *)(p_Var17 + 2);
      if (lVar6 != 0) {
        local_434.length = 0;
        local_434.data[0] = '\0';
        local_5c8 = p_Var17;
        memset(local_434.data + 1,0x1b,0x3ff);
        __n = *(ulong *)(lVar6 + 0x70);
        if (__n < 0x400) {
          local_434.length = (ai_uint32)__n;
          memcpy(local_434.data,*(void **)(lVar6 + 0x68),__n);
          local_434.data[__n] = '\0';
        }
        __k = *(key_type **)(lVar6 + 0xe8);
        if ((__k != (key_type *)0x0) && (__k->contentLength != 0)) {
          iVar8 = std::
                  _Rb_tree<const_Assimp::FBX::Video,_std::pair<const_Assimp::FBX::Video,_unsigned_int>,_std::_Select1st<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>,_std::less<const_Assimp::FBX::Video>,_std::allocator<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>_>
                  ::find(&local_5e0->_M_t,__k);
          if (iVar8._M_node == local_5d0) {
            uVar19 = ConvertVideo(this,__k);
            pmVar9 = std::
                     map<const_Assimp::FBX::Video,_unsigned_int,_std::less<const_Assimp::FBX::Video>,_std::allocator<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>_>
                     ::operator[](local_5e0,__k);
            *pmVar9 = uVar19;
          }
          else {
            uVar19 = *(uint *)&iVar8._M_node[6]._M_right;
          }
          local_434.data[0] = '*';
          local_434.length = 1;
          if ((int)uVar19 < 0) {
            local_434.data[1] = '-';
            uVar19 = -uVar19;
            local_434.length = 2;
            pcVar20 = local_434.data + 2;
          }
          else {
            pcVar20 = local_434.data + 1;
          }
          iVar4 = 1000000000;
          bVar2 = 0;
          do {
            bVar21 = (int)((long)(int)uVar19 / (long)iVar4) != 0;
            bVar22 = iVar4 == 1;
            if ((bool)(bVar2 | bVar22 | bVar21)) {
              *pcVar20 = (char)((long)(int)uVar19 / (long)iVar4) + '0';
              pcVar20 = pcVar20 + 1;
              local_434.length = local_434.length + 1;
              uVar19 = (int)uVar19 % iVar4;
              if (iVar4 == 1) break;
            }
            iVar4 = iVar4 / 10;
            bVar2 = bVar2 | bVar22 | bVar21;
          } while (local_434.length < 0x3ff);
          *pcVar20 = '\0';
          this = local_680;
        }
        paVar3 = local_6a8;
        local_5c0._0_8_ = local_5c0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5c0,local_678._M_dataplus._M_p,
                   local_678._M_dataplus._M_p + local_678._M_string_length);
        std::__cxx11::string::append((char *)local_5c0);
        aiMaterial::AddProperty(paVar3,&local_434,(char *)local_5c0._0_8_,0x12,0);
        if ((undefined1 *)local_5c0._0_8_ != local_5c0 + 0x10) {
          operator_delete((void *)local_5c0._0_8_,(ulong)(local_5c0._16_8_ + 1));
        }
        paVar3 = local_6a8;
        local_438 = 0;
        local_448 = *(undefined4 *)(lVar6 + 0x38);
        uStack_444 = *(undefined4 *)(lVar6 + 0x3c);
        uStack_440 = *(undefined4 *)(lVar6 + 0x40);
        uStack_43c = *(undefined4 *)(lVar6 + 0x44);
        local_5c0._0_8_ = local_5c0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5c0,local_678._M_dataplus._M_p,
                   local_678._M_dataplus._M_p + local_678._M_string_length);
        std::__cxx11::string::append((char *)local_5c0);
        aiMaterial::AddBinaryProperty
                  (paVar3,&local_448,0x14,(char *)local_5c0._0_8_,0x12,0,aiPTI_Float);
        if ((undefined1 *)local_5c0._0_8_ != local_5c0 + 0x10) {
          operator_delete((void *)local_5c0._0_8_,(ulong)(local_5c0._16_8_ + 1));
        }
        local_6ac = 0;
        this_00 = *(PropertyTable **)(lVar6 + 200);
        if (this_00 == (PropertyTable *)0x0) {
          __assert_fail("props.get()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXDocument.h"
                        ,0x1f7,"const PropertyTable &Assimp::FBX::Texture::Props() const");
        }
        local_5c0._0_8_ = local_5c0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"UVSet","");
        pPVar10 = PropertyTable::Get(this_00,(string *)local_5c0);
        if ((pPVar10 == (Property *)0x0) ||
           (lVar6 = __dynamic_cast(pPVar10,&Property::typeinfo,
                                   &TypedProperty<std::__cxx11::string>::typeinfo,0), lVar6 == 0)) {
          local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
          local_638._M_string_length = 0;
          local_638.field_2._M_local_buf[0] = '\0';
          bVar21 = false;
        }
        else {
          local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
          bVar21 = true;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_638,*(long *)(lVar6 + 8),
                     *(long *)(lVar6 + 0x10) + *(long *)(lVar6 + 8));
        }
        if ((undefined1 *)local_5c0._0_8_ != local_5c0 + 0x10) {
          operator_delete((void *)local_5c0._0_8_,(ulong)(local_5c0._16_8_ + 1));
        }
        if (((bVar21) && (iVar4 = std::__cxx11::string::compare((char *)&local_638), iVar4 != 0)) &&
           (local_638._M_string_length != 0)) {
          _Var11 = std::
                   __find_if<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,__gnu_cxx::__ops::_Iter_equals_val<aiMaterial*const>>
                             ((this->materials).
                              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (this->materials).
                              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish,&local_6a8);
          local_604 = (undefined4)
                      ((ulong)((long)_Var11._M_current -
                              (long)(this->materials).
                                    super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 3);
          local_6ac = 0xffffffff;
          if (local_610 == (MeshGeometry *)0x0) {
            p_Var17 = (this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if (p_Var17 != local_5d8) {
              do {
                uVar19 = local_6ac;
                if ((*(long *)(p_Var17 + 1) != 0) &&
                   (this_01 = (MeshGeometry *)
                              __dynamic_cast(*(long *)(p_Var17 + 1),&Geometry::typeinfo,
                                             &MeshGeometry::typeinfo,0), uVar19 = local_6ac,
                   this_01 != (MeshGeometry *)0x0)) {
                  pMVar14 = MeshGeometry::GetMaterialIndices(this_01);
                  _Var15 = std::
                           __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                     ((pMVar14->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (pMVar14->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish,&local_604);
                  uVar19 = local_6ac;
                  if (_Var15._M_current !=
                      (pMVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
                    uVar19 = 0xffffffff;
                    uVar5 = 0;
                    do {
                      pvVar12 = MeshGeometry::GetTextureCoords(this_01,uVar5);
                      if ((pvVar12->
                          super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start ==
                          (pvVar12->
                          super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish) break;
                      MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                                ((string *)local_5c0,this_01,uVar5);
                      uVar1 = local_5c0._0_8_;
                      if (local_5c0._8_8_ == local_638._M_string_length) {
                        if (local_5c0._8_8_ == 0) {
                          bVar21 = false;
                          uVar19 = uVar5;
                        }
                        else {
                          iVar4 = bcmp((void *)local_5c0._0_8_,local_638._M_dataplus._M_p,
                                       local_5c0._8_8_);
                          bVar21 = iVar4 != 0;
                          if (!bVar21) {
                            uVar19 = uVar5;
                          }
                        }
                      }
                      else {
                        bVar21 = true;
                      }
                      if ((undefined1 *)uVar1 != local_5c0 + 0x10) {
                        operator_delete((void *)uVar1,(ulong)(local_5c0._16_8_ + 1));
                      }
                      bVar22 = uVar5 < 7;
                      uVar5 = uVar5 + 1;
                    } while ((bool)(bVar21 & bVar22));
                    if (uVar19 == 0xffffffff) {
                      std::operator+(&local_658,"did not find UV channel named ",&local_638);
                      puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_658);
                      local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
                      psVar18 = puVar16 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar16 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar18) {
                        local_6a0.field_2._M_allocated_capacity = *psVar18;
                        local_6a0.field_2._8_8_ = puVar16[3];
                      }
                      else {
                        local_6a0.field_2._M_allocated_capacity = *psVar18;
                        local_6a0._M_dataplus._M_p = (pointer)*puVar16;
                      }
                      local_6a0._M_string_length = puVar16[1];
                      *puVar16 = psVar18;
                      puVar16[1] = 0;
                      *(undefined1 *)(puVar16 + 2) = 0;
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      basic_formatter<std::__cxx11::string>
                                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  *)local_5c0,&local_6a0);
                      LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
                    }
                    else {
                      if (local_6ac == 0xffffffff) goto LAB_005ddc6a;
                      std::operator+(&local_658,"the UV channel named ",&local_638);
                      plVar13 = (long *)std::__cxx11::string::append((char *)&local_658);
                      local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
                      psVar18 = (size_type *)(plVar13 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar13 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar18) {
                        local_6a0.field_2._M_allocated_capacity = *psVar18;
                        local_6a0.field_2._8_8_ = plVar13[3];
                      }
                      else {
                        local_6a0.field_2._M_allocated_capacity = *psVar18;
                        local_6a0._M_dataplus._M_p = (pointer)*plVar13;
                      }
                      local_6a0._M_string_length = plVar13[1];
                      *plVar13 = (long)psVar18;
                      plVar13[1] = 0;
                      *(undefined1 *)(plVar13 + 2) = 0;
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      basic_formatter<std::__cxx11::string>
                                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  *)local_5c0,&local_6a0);
                      LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
                    std::ios_base::~ios_base(local_550);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                      operator_delete(local_6a0._M_dataplus._M_p,
                                      local_6a0.field_2._M_allocated_capacity + 1);
                    }
                    uVar19 = local_6ac;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_658._M_dataplus._M_p != &local_658.field_2) {
                      operator_delete(local_658._M_dataplus._M_p,
                                      local_658.field_2._M_allocated_capacity + 1);
                      uVar19 = local_6ac;
                    }
                  }
                }
LAB_005ddc6a:
                local_6ac = uVar19;
                p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
                uVar19 = local_6ac;
              } while (p_Var17 != local_5d8);
              goto LAB_005ddd22;
            }
LAB_005ddd2b:
            std::operator+(&local_658,"failed to resolve UV channel ",&local_638);
            puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_658);
            psVar18 = puVar16 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar16 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_6a0.field_2._M_allocated_capacity = *psVar18;
              local_6a0.field_2._8_8_ = puVar16[3];
              local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
            }
            else {
              local_6a0.field_2._M_allocated_capacity = *psVar18;
              local_6a0._M_dataplus._M_p = (pointer)*puVar16;
            }
            local_6a0._M_string_length = puVar16[1];
            *puVar16 = psVar18;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
            basic_formatter<std::__cxx11::string>
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       local_5c0,&local_6a0);
            LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
            std::ios_base::~ios_base(local_550);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
              operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_658._M_dataplus._M_p != &local_658.field_2) {
              operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1
                             );
            }
            local_6ac = 0;
            this = local_680;
          }
          else {
            uVar19 = 0xffffffff;
            uVar5 = 0;
            do {
              pvVar12 = MeshGeometry::GetTextureCoords(local_610,uVar5);
              if ((pvVar12->
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start ==
                  (pvVar12->
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish) break;
              MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                        ((string *)local_5c0,local_610,uVar5);
              uVar1 = local_5c0._0_8_;
              if (local_5c0._8_8_ == local_638._M_string_length) {
                if (local_5c0._8_8_ == 0) {
                  bVar21 = false;
                  uVar19 = uVar5;
                }
                else {
                  iVar4 = bcmp((void *)local_5c0._0_8_,local_638._M_dataplus._M_p,local_5c0._8_8_);
                  bVar21 = iVar4 != 0;
                  if (!bVar21) {
                    uVar19 = uVar5;
                  }
                }
              }
              else {
                bVar21 = true;
              }
              if ((undefined1 *)uVar1 != local_5c0 + 0x10) {
                operator_delete((void *)uVar1,(ulong)(local_5c0._16_8_ + 1));
              }
              bVar22 = uVar5 < 7;
              uVar5 = uVar5 + 1;
            } while ((bool)(bVar21 & bVar22));
            if (uVar19 == 0xffffffff) {
              std::operator+(&local_658,"did not find UV channel named ",&local_638);
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_658);
              local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
              psVar18 = (size_type *)(plVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_6a0.field_2._M_allocated_capacity = *psVar18;
                local_6a0.field_2._8_8_ = plVar13[3];
              }
              else {
                local_6a0.field_2._M_allocated_capacity = *psVar18;
                local_6a0._M_dataplus._M_p = (pointer)*plVar13;
              }
              local_6a0._M_string_length = plVar13[1];
              *plVar13 = (long)psVar18;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              basic_formatter<std::__cxx11::string>
                        ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         local_5c0,&local_6a0);
              LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
              std::ios_base::~ios_base(local_550);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                operator_delete(local_6a0._M_dataplus._M_p,
                                local_6a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_658._M_dataplus._M_p != &local_658.field_2) {
                operator_delete(local_658._M_dataplus._M_p,
                                local_658.field_2._M_allocated_capacity + 1);
              }
            }
            this = local_680;
            if (local_6ac == 0xffffffff) {
LAB_005ddd22:
              local_6ac = uVar19;
              this = local_680;
              if (local_6ac == 0xffffffff) goto LAB_005ddd2b;
            }
          }
        }
        paVar3 = local_6a8;
        local_5c0._0_8_ = local_5c0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5c0,local_678._M_dataplus._M_p,
                   local_678._M_dataplus._M_p + local_678._M_string_length);
        std::__cxx11::string::append((char *)local_5c0);
        aiMaterial::AddBinaryProperty
                  (paVar3,&local_6ac,4,(char *)local_5c0._0_8_,0x12,0,aiPTI_Integer);
        p_Var17 = local_5c8;
        if ((undefined1 *)local_5c0._0_8_ != local_5c0 + 0x10) {
          operator_delete((void *)local_5c0._0_8_,(ulong)(local_5c0._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_638._M_dataplus._M_p != &local_638.field_2) {
          operator_delete(local_638._M_dataplus._M_p,
                          CONCAT71(local_638.field_2._M_allocated_capacity._1_7_,
                                   local_638.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_678._M_dataplus._M_p != &local_678.field_2) {
        operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
      }
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
    } while (p_Var17 != local_618);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_600._M_dataplus._M_p != &local_600.field_2) {
    operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FBXConverter::SetShadingPropertiesRaw(aiMaterial* out_mat, const PropertyTable& props, const TextureMap& textures, const MeshGeometry* const mesh)
{
    // Add all the unparsed properties with a "$raw." prefix

    const std::string prefix = "$raw.";

    for (const DirectPropertyMap::value_type& prop : props.GetUnparsedProperties()) {

        std::string name = prefix + prop.first;

        if (const TypedProperty<aiVector3D>* interpreted = prop.second->As<TypedProperty<aiVector3D> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<aiColor3D>* interpreted = prop.second->As<TypedProperty<aiColor3D> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<aiColor4D>* interpreted = prop.second->As<TypedProperty<aiColor4D> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<float>* interpreted = prop.second->As<TypedProperty<float> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<int>* interpreted = prop.second->As<TypedProperty<int> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<bool>* interpreted = prop.second->As<TypedProperty<bool> >())
        {
            int value = interpreted->Value() ? 1 : 0;
            out_mat->AddProperty(&value, 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<std::string>* interpreted = prop.second->As<TypedProperty<std::string> >())
        {
            const aiString value = aiString(interpreted->Value());
            out_mat->AddProperty(&value, name.c_str(), 0, 0);
        }
    }

    // Add the textures' properties

    for (TextureMap::const_iterator it = textures.begin(); it != textures.end(); it++) {

        std::string name = prefix + it->first;

        const Texture* const tex = (*it).second;
        if (tex != nullptr)
        {
            aiString path;
            path.Set(tex->RelativeFilename());

            const Video* media = tex->Media();
            if (media != nullptr && media->ContentLength() > 0) {
                unsigned int index;

                VideoMap::const_iterator it = textures_converted.find(*media);
                if (it != textures_converted.end()) {
                    index = (*it).second;
                }
                else {
                    index = ConvertVideo(*media);
                    textures_converted[*media] = index;
                }

                // setup texture reference string (copied from ColladaLoader::FindFilenameForEffectTexture)
                path.data[0] = '*';
                path.length = 1 + ASSIMP_itoa10(path.data + 1, MAXLEN - 1, index);
            }

            out_mat->AddProperty(&path, (name + "|file").c_str(), aiTextureType_UNKNOWN, 0);

            aiUVTransform uvTrafo;
            // XXX handle all kinds of UV transformations
            uvTrafo.mScaling = tex->UVScaling();
            uvTrafo.mTranslation = tex->UVTranslation();
            out_mat->AddProperty(&uvTrafo, 1, (name + "|uvtrafo").c_str(), aiTextureType_UNKNOWN, 0);
 
            int uvIndex = 0;

            bool uvFound = false;
            const std::string& uvSet = PropertyGet<std::string>(tex->Props(), "UVSet", uvFound);
            if (uvFound) {
                // "default" is the name which usually appears in the FbxFileTexture template
                if (uvSet != "default" && uvSet.length()) {
                    // this is a bit awkward - we need to find a mesh that uses this
                    // material and scan its UV channels for the given UV name because
                    // assimp references UV channels by index, not by name.

                    // XXX: the case that UV channels may appear in different orders
                    // in meshes is unhandled. A possible solution would be to sort
                    // the UV channels alphabetically, but this would have the side
                    // effect that the primary (first) UV channel would sometimes
                    // be moved, causing trouble when users read only the first
                    // UV channel and ignore UV channel assignments altogether.

                    std::vector<aiMaterial*>::iterator materialIt = std::find(materials.begin(), materials.end(), out_mat);
                    const unsigned int matIndex = static_cast<unsigned int>(std::distance(materials.begin(), materialIt));

                    uvIndex = -1;
                    if (!mesh)
                    {
                        for (const MeshMap::value_type& v : meshes_converted) {
                            const MeshGeometry* const meshGeom = dynamic_cast<const MeshGeometry*>(v.first);
                            if (!meshGeom) {
                                continue;
                            }

                            const MatIndexArray& mats = meshGeom->GetMaterialIndices();
                            if (std::find(mats.begin(), mats.end(), matIndex) == mats.end()) {
                                continue;
                            }

                            int index = -1;
                            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                if (meshGeom->GetTextureCoords(i).empty()) {
                                    break;
                                }
                                const std::string& name = meshGeom->GetTextureCoordChannelName(i);
                                if (name == uvSet) {
                                    index = static_cast<int>(i);
                                    break;
                                }
                            }
                            if (index == -1) {
                                FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                                continue;
                            }

                            if (uvIndex == -1) {
                                uvIndex = index;
                            }
                            else {
                                FBXImporter::LogWarn("the UV channel named " + uvSet + " appears at different positions in meshes, results will be wrong");
                            }
                        }
                    }
                    else
                    {
                        int index = -1;
                        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                            if (mesh->GetTextureCoords(i).empty()) {
                                break;
                            }
                            const std::string& name = mesh->GetTextureCoordChannelName(i);
                            if (name == uvSet) {
                                index = static_cast<int>(i);
                                break;
                            }
                        }
                        if (index == -1) {
                            FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                        }

                        if (uvIndex == -1) {
                            uvIndex = index;
                        }
                    }

                    if (uvIndex == -1) {
                        FBXImporter::LogWarn("failed to resolve UV channel " + uvSet + ", using first UV channel");
                        uvIndex = 0;
                    }
                }
            }

            out_mat->AddProperty(&uvIndex, 1, (name + "|uvwsrc").c_str(), aiTextureType_UNKNOWN, 0);
        }
            }
        }